

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O0

int aec_decode_range(aec_stream_conflict *strm,size_t *rsi_offsets,size_t rsi_offsets_count,
                    size_t pos,size_t size)

{
  internal_state_conflict *piVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  undefined1 local_a8 [8];
  aec_stream_conflict strm_tmp;
  uchar *out_tmp;
  size_t rsi_n;
  size_t rsi_size;
  int status;
  internal_state_conflict *state;
  size_t size_local;
  size_t pos_local;
  size_t rsi_offsets_count_local;
  size_t *rsi_offsets_local;
  aec_stream_conflict *strm_local;
  
  piVar1 = strm->state;
  memcpy(local_a8,strm,0x48);
  if (piVar1->pp == 0) {
    piVar1->ref = 0;
    piVar1->encoded_block_size = strm->block_size;
  }
  else {
    piVar1->ref = 1;
    piVar1->encoded_block_size = strm->block_size - 1;
  }
  piVar1->rsip = piVar1->rsi_buffer;
  piVar1->flush_start = piVar1->rsi_buffer;
  piVar1->bitp = 0;
  piVar1->fs = 0;
  piVar1->mode = m_id;
  uVar2 = (ulong)(strm->rsi * strm->block_size * piVar1->bytes_per_sample);
  uVar3 = pos / uVar2;
  if (uVar3 < rsi_offsets_count) {
    strm_tmp.avail_out = 0;
    uVar4 = size + pos % uVar2 + 1;
    strm_tmp.next_out =
         (uchar *)(((ulong)piVar1->bytes_per_sample - uVar4 % (ulong)piVar1->bytes_per_sample) +
                  uVar4);
    strm_tmp.total_in = (size_t)malloc((size_t)strm_tmp.next_out);
    if ((internal_state_conflict *)strm_tmp.total_in == (internal_state_conflict *)0x0) {
      strm_local._4_4_ = -4;
    }
    else {
      strm_tmp.state = (internal_state_conflict *)strm_tmp.total_in;
      strm_local._4_4_ = aec_buffer_seek((aec_stream_conflict *)local_a8,rsi_offsets[uVar3]);
      if ((strm_local._4_4_ == 0) &&
         (strm_local._4_4_ = aec_decode((aec_stream_conflict *)local_a8,1), strm_local._4_4_ == 0))
      {
        memcpy(strm->next_out,(void *)((long)strm_tmp.state + (pos - uVar3 * uVar2)),size);
        strm->next_out = strm->next_out + size;
        strm->avail_out = strm->avail_out - size;
        strm->total_out = size + strm->total_out;
        free(strm_tmp.state);
        strm_local._4_4_ = 0;
      }
    }
  }
  else {
    strm_local._4_4_ = -3;
  }
  return strm_local._4_4_;
}

Assistant:

int aec_decode_range(struct aec_stream *strm, const size_t *rsi_offsets, size_t rsi_offsets_count, size_t pos, size_t size)
{
    struct internal_state *state = strm->state;
    int status;
    size_t rsi_size;
    size_t rsi_n;
    unsigned char *out_tmp;
    struct aec_stream strm_tmp = *strm;

    if (state->pp) {
        state->ref = 1;
        state->encoded_block_size = strm->block_size - 1;
    } else {
        state->ref = 0;
        state->encoded_block_size = strm->block_size;
    }

    state->rsip = state->rsi_buffer;
    state->flush_start = state->rsi_buffer;
    state->bitp = 0;
    state->fs = 0;
    state->mode = m_id;

    rsi_size = strm->rsi * strm->block_size * state->bytes_per_sample;
    rsi_n = pos / rsi_size;
    if (rsi_n >= rsi_offsets_count)
        return AEC_DATA_ERROR;

    /* resize and align to bytes_per_sample */
    strm_tmp.total_out = 0;
    strm_tmp.avail_out = size + pos % rsi_size + 1;
    strm_tmp.avail_out += state->bytes_per_sample - strm_tmp.avail_out % state->bytes_per_sample;
    if ((out_tmp = malloc(strm_tmp.avail_out)) == NULL)
        return AEC_MEM_ERROR;
    strm_tmp.next_out = out_tmp;

    if ((status = aec_buffer_seek(&strm_tmp, rsi_offsets[rsi_n])) != AEC_OK)
        return status;

    if ((status = aec_decode(&strm_tmp, AEC_FLUSH)) != 0)
        return status;

    memcpy(strm->next_out, out_tmp + (pos - rsi_n * rsi_size), size);

    strm->next_out += size;
    strm->avail_out -= size;
    strm->total_out += size;
    free(out_tmp);

    return AEC_OK;
}